

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHABlockSize(SHAversion whichSha)

{
  int local_c;
  SHAversion whichSha_local;
  
  switch(whichSha) {
  case SHA1:
    local_c = 0x40;
    break;
  case SHA224:
    local_c = 0x40;
    break;
  case SHA256:
    local_c = 0x40;
    break;
  case SHA384:
    local_c = 0x80;
    break;
  default:
    local_c = 0x80;
  }
  return local_c;
}

Assistant:

int USHABlockSize(enum SHAversion whichSha)
{
    switch (whichSha) {
    case SHA1:   return SHA1_Message_Block_Size;
    case SHA224: return SHA224_Message_Block_Size;
    case SHA256: return SHA256_Message_Block_Size;
    case SHA384: return SHA384_Message_Block_Size;
    default:
    case SHA512: return SHA512_Message_Block_Size;
    }
}